

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

int mwTestNow(char *file,int line,int always_invoked)

{
  int iVar1;
  char *pcVar2;
  mwData *pmVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  mwData *pmVar9;
  
  if (always_invoked == 0 && file != (char *)0x0) {
    pcVar7 = "chain ";
    if ((mwTestFlags & 1U) == 0) {
      pcVar7 = "";
    }
    pcVar8 = "alloc ";
    if ((mwTestFlags & 2U) == 0) {
      pcVar8 = "";
    }
    pcVar2 = "nomansland ";
    if ((mwTestFlags & 4U) == 0) {
      pcVar2 = "";
    }
    mwWrite("check: <%ld> %s(%d), checking %s%s%s\n",mwCounter,file,line,pcVar7,pcVar8,pcVar2);
  }
  iVar5 = 0;
  if (mwHead != (mwData *)0x0 && (mwTestFlags & 1U) != 0) {
    iVar5 = 0;
    pmVar9 = mwHead;
    do {
      uVar6 = 0;
      if (mwDataSize != '\0') {
        uVar6 = 0x38;
      }
      iVar1 = mwIsSafeAddr(pmVar9,uVar6);
      if (iVar1 == 0) {
LAB_00106dd1:
        if (always_invoked != 0) {
          mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
        }
        mwWrite("check: heap corruption detected\n");
        mwErrors = mwErrors + 1;
        iVar1 = mwFlushR();
        mwFlushingB2 = iVar1 + 1;
        mwFlushingB1 = mwFlushingB2;
        mwFlushing = mwFlushingB2;
        mwFlush();
        return iVar5 + 1;
      }
      if (pmVar9->prev != (mwData *)0x0) {
        uVar6 = 0;
        if (mwDataSize != '\0') {
          uVar6 = 0x38;
        }
        iVar1 = mwIsSafeAddr(pmVar9->prev,uVar6);
        if (iVar1 == 0) goto LAB_00106dd1;
        if ((pmVar9 == mwHead) || (pmVar9->prev->next != pmVar9)) {
          if (always_invoked != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
          }
          always_invoked = 0;
          mwWrite("check: heap chain broken, prev link incorrect\n");
          mwErrors = mwErrors + 1;
          iVar1 = mwFlushR();
          mwFlushingB2 = iVar1 + 1;
          mwFlushingB1 = mwFlushingB2;
          mwFlushing = mwFlushingB2;
          mwFlush();
          iVar5 = iVar5 + 1;
        }
      }
      if (pmVar9->next == (mwData *)0x0) {
        if (pmVar9 == mwTail) break;
        pcVar7 = "check: heap chain broken, tail incorrect\n";
LAB_00106c57:
        if (always_invoked != 0) {
          mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
        }
        always_invoked = 0;
        mwWrite(pcVar7);
        mwErrors = mwErrors + 1;
        iVar1 = mwFlushR();
        mwFlushingB2 = iVar1 + 1;
        mwFlushingB1 = mwFlushingB2;
        mwFlushing = mwFlushingB2;
        mwFlush();
        iVar5 = iVar5 + 1;
        pmVar3 = pmVar9->next;
      }
      else {
        uVar6 = 0;
        if (mwDataSize != '\0') {
          uVar6 = 0x38;
        }
        iVar1 = mwIsSafeAddr(pmVar9->next,uVar6);
        if (iVar1 == 0) goto LAB_00106dd1;
        if ((pmVar9 == mwTail) || (pmVar3 = pmVar9->next, pmVar3->prev != pmVar9)) {
          pcVar7 = "check: heap chain broken, next link incorrect\n";
          goto LAB_00106c57;
        }
      }
      pmVar9 = pmVar3;
    } while (pmVar3 != (mwData *)0x0);
  }
  pmVar9 = mwHead;
  if (mwHead != (mwData *)0x0 && (mwTestFlags & 2U) != 0) {
    do {
      iVar1 = mwTestBuf(pmVar9,file,line);
      iVar5 = (iVar5 + 1) - (uint)(iVar1 == 0);
      pmVar9 = pmVar9->next;
    } while (pmVar9 != (mwData *)0x0);
  }
  pmVar9 = mwHead;
  if (mwHead != (mwData *)0x0 && (mwTestFlags & 4U) != 0) {
    do {
      if ((pmVar9->flag & 1) != 0) {
        pmVar3 = pmVar9 + 1;
        if (mwDataSize == '\0') {
          pmVar3 = pmVar9;
        }
        iVar1 = (int)pmVar9->size;
        if (iVar1 != 0) {
          lVar4 = 0;
          do {
            if (*(char *)((long)&pmVar3->next + lVar4) != -4) {
              mwErrors = mwErrors + 1;
              iVar1 = mwFlushR();
              mwFlushingB2 = iVar1 + 1;
              mwFlushingB1 = mwFlushingB2;
              mwFlushing = mwFlushingB2;
              mwFlush();
              mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",pmVar9->count,
                      &pmVar3->file,pmVar9->file,(ulong)(uint)pmVar9->line);
              break;
            }
            lVar4 = lVar4 + 1;
          } while (iVar1 != (int)lVar4);
        }
      }
      pmVar9 = pmVar9->next;
    } while (pmVar9 != (mwData *)0x0);
  }
  if (((file != (char *)0x0) && (always_invoked == 0)) && (iVar5 == 0)) {
    iVar5 = 0;
    mwWrite("check: <%ld> %s(%d), complete; no errors\n",mwCounter,file,line);
  }
  return iVar5;
}

Assistant:

static int mwTestNow(const char *file, int line, int always_invoked)
{
	int retv = 0;
	mwData *mw;
	char *data;

	if (file && !always_invoked)
		mwWrite("check: <%ld> %s(%d), checking %s%s%s\n",
				mwCounter, file, line,
				(mwTestFlags & MW_TEST_CHAIN) ? "chain " : "",
				(mwTestFlags & MW_TEST_ALLOC) ? "alloc " : "",
				(mwTestFlags & MW_TEST_NML) ? "nomansland " : ""
			   );

	if (mwTestFlags & MW_TEST_CHAIN) {
		for (mw = mwHead; mw; mw = mw->next) {
			if (!mwIsSafeAddr(mw, mwDataSize)) {
				AIPH();
				mwWrite("check: heap corruption detected\n");
				mwIncErr();
				return retv + 1;
			}
			if (mw->prev) {
				if (!mwIsSafeAddr(mw->prev, mwDataSize)) {
					AIPH();
					mwWrite("check: heap corruption detected\n");
					mwIncErr();
					return retv + 1;
				}
				if (mw == mwHead || mw->prev->next != mw) {
					AIPH();
					mwWrite("check: heap chain broken, prev link incorrect\n");
					mwIncErr();
					retv ++;
				}
			}
			if (mw->next) {
				if (!mwIsSafeAddr(mw->next, mwDataSize)) {
					AIPH();
					mwWrite("check: heap corruption detected\n");
					mwIncErr();
					return retv + 1;
				}
				if (mw == mwTail || mw->next->prev != mw) {
					AIPH();
					mwWrite("check: heap chain broken, next link incorrect\n");
					mwIncErr();
					retv ++;
				}
			} else if (mw != mwTail) {
				AIPH();
				mwWrite("check: heap chain broken, tail incorrect\n");
				mwIncErr();
				retv ++;
			}
		}
	}
	if (mwTestFlags & MW_TEST_ALLOC) {
		for (mw = mwHead; mw; mw = mw->next) {
			if (mwTestBuf(mw, file, line)) {
				retv ++;
			}
		}
	}
	if (mwTestFlags & MW_TEST_NML) {
		for (mw = mwHead; mw; mw = mw->next) {
			if ((mw->flag & MW_NML)) {
				data = ((char *)mw) + mwDataSize + mwOverflowZoneSize;
				if (mwTestMem(data, mw->size, MW_VAL_NML)) {
					mwIncErr();
					mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
							mw->count, data + mwOverflowZoneSize, mw->file, mw->line);
				}
			}
		}
	}


	if (file && !always_invoked && !retv)
		mwWrite("check: <%ld> %s(%d), complete; no errors\n",
				mwCounter, file, line);
	return retv;
}